

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

void __thiscall QDomDocumentPrivate::QDomDocumentPrivate(QDomDocumentPrivate *this)

{
  QAtomicInt *pQVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  QDomImplementationPrivate *pQVar5;
  QDomDocumentTypePrivate *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QDomNodePrivate::QDomNodePrivate
            (&this->super_QDomNodePrivate,(QDomDocumentPrivate *)0x0,(QDomNodePrivate *)0x0);
  (this->super_QDomNodePrivate)._vptr_QDomNodePrivate =
       (_func_int **)&PTR__QDomDocumentPrivate_001275c0;
  pQVar5 = (QDomImplementationPrivate *)operator_new(4);
  (pQVar5->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  (this->impl).d.ptr = pQVar5;
  LOCK();
  (pQVar5->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar5->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  (this->type).d.ptr = (QDomDocumentTypePrivate *)0x0;
  this->nodeListTime = 1;
  this_00 = (QDomDocumentTypePrivate *)operator_new(0x100);
  QDomDocumentTypePrivate::QDomDocumentTypePrivate(this_00,this,&this->super_QDomNodePrivate);
  QExplicitlySharedDataPointer<QDomDocumentTypePrivate>::reset(&this->type,this_00);
  LOCK();
  pQVar1 = &(((this->type).d.ptr)->super_QDomNodePrivate).ref;
  (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  Qt::Literals::StringLiterals::operator____s((QString *)&local_38,L"#document",9);
  pDVar3 = (this->super_QDomNodePrivate).name.d.d;
  pcVar4 = (this->super_QDomNodePrivate).name.d.ptr;
  (this->super_QDomNodePrivate).name.d.d = local_38.d;
  (this->super_QDomNodePrivate).name.d.ptr = local_38.ptr;
  qVar2 = (this->super_QDomNodePrivate).name.d.size;
  (this->super_QDomNodePrivate).name.d.size = local_38.size;
  local_38.d = pDVar3;
  local_38.ptr = pcVar4;
  local_38.size = qVar2;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDomDocumentPrivate::QDomDocumentPrivate()
    : QDomNodePrivate(nullptr),
      impl(new QDomImplementationPrivate),
      nodeListTime(1)
{
    type = new QDomDocumentTypePrivate(this, this);
    type->ref.deref();

    name = u"#document"_s;
}